

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall TestSchema::buildSchema(TestSchema *this)

{
  string *psVar1;
  bool caught;
  undefined1 local_1b8 [24];
  char *local_1a0;
  allocator<char> local_191 [9];
  string s;
  UnionSchema onion;
  RecordSchema record;
  LongSchema local_138;
  FixedSchema fixed;
  EnumSchema myenum;
  RecordSchema nestedRecord;
  MapSchema map;
  IntSchema intSchema;
  ArraySchema array;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"RootRecord",(allocator<char> *)local_1b8);
  avro::RecordSchema::RecordSchema(&record,(string *)&s);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"mylong",(allocator<char> *)&intSchema);
  avro::LongSchema::LongSchema((LongSchema *)local_1b8);
  avro::RecordSchema::addField((string *)&record,(Schema *)&s);
  avro::Schema::~Schema((Schema *)local_1b8);
  std::__cxx11::string::~string((string *)&s);
  avro::IntSchema::IntSchema(&intSchema);
  avro::IntSchema::IntSchema((IntSchema *)&s);
  avro::MapSchema::MapSchema(&map,(Schema *)&s);
  avro::Schema::~Schema((Schema *)&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"mymap",(allocator<char> *)local_1b8);
  avro::RecordSchema::addField((string *)&record,(Schema *)&s);
  std::__cxx11::string::~string((string *)&s);
  avro::DoubleSchema::DoubleSchema((DoubleSchema *)&s);
  avro::ArraySchema::ArraySchema(&array,(Schema *)&s);
  avro::Schema::~Schema((Schema *)&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"myarray",(allocator<char> *)local_1b8);
  avro::RecordSchema::addField((string *)&record,(Schema *)&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"ExampleEnum",(allocator<char> *)&onion);
  avro::EnumSchema::EnumSchema(&myenum,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"zero",(allocator<char> *)&onion);
  avro::EnumSchema::addSymbol((string *)&myenum);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"one",(allocator<char> *)&onion);
  avro::EnumSchema::addSymbol((string *)&myenum);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"two",(allocator<char> *)&onion);
  avro::EnumSchema::addSymbol((string *)&myenum);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"three",(allocator<char> *)&onion);
  avro::EnumSchema::addSymbol((string *)&myenum);
  std::__cxx11::string::~string((string *)local_1b8);
  caught = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"three",(allocator<char> *)&onion);
  avro::EnumSchema::addSymbol((string *)&myenum);
  psVar1 = (string *)local_1b8;
  std::__cxx11::string::~string(psVar1);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_40,0x62,&local_50);
  local_1b8[8] = 0;
  local_1b8._0_8_ = &PTR__lazy_ostream_001f1370;
  local_1b8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_58 = "";
  onion = (UnionSchema)0x1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_1b8,&local_60,0x62,1,2,&caught,"caught",(allocator<char> *)&onion,"true");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"myenum",(allocator<char> *)&onion);
  avro::RecordSchema::addField((string *)&record,(Schema *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  avro::UnionSchema::UnionSchema(&onion);
  avro::NullSchema::NullSchema((NullSchema *)local_1b8);
  avro::UnionSchema::addType((Schema *)&onion);
  avro::Schema::~Schema((Schema *)local_1b8);
  avro::UnionSchema::addType((Schema *)&onion);
  avro::FloatSchema::FloatSchema((FloatSchema *)local_1b8);
  avro::UnionSchema::addType((Schema *)&onion);
  avro::Schema::~Schema((Schema *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"myunion",(allocator<char> *)&nestedRecord);
  avro::RecordSchema::addField((string *)&record,(Schema *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"NestedRecord",(allocator<char> *)&fixed);
  avro::RecordSchema::RecordSchema(&nestedRecord,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"floatInNested",(allocator<char> *)&local_138);
  avro::FloatSchema::FloatSchema((FloatSchema *)&fixed);
  avro::RecordSchema::addField((string *)&nestedRecord,(Schema *)local_1b8);
  avro::Schema::~Schema((Schema *)&fixed);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"nested",(allocator<char> *)&fixed);
  avro::RecordSchema::addField((string *)&record,(Schema *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"mybool",(allocator<char> *)&local_138);
  avro::BoolSchema::BoolSchema((BoolSchema *)&fixed);
  avro::RecordSchema::addField((string *)&record,(Schema *)local_1b8);
  avro::Schema::~Schema((Schema *)&fixed);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"fixed16",(allocator<char> *)&local_138);
  avro::FixedSchema::FixedSchema(&fixed,0x10,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"myfixed",(allocator<char> *)&local_138);
  avro::RecordSchema::addField((string *)&record,(Schema *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  caught = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b8,"mylong",local_191);
  avro::LongSchema::LongSchema(&local_138);
  avro::RecordSchema::addField((string *)&record,(Schema *)local_1b8);
  avro::Schema::~Schema(&local_138.super_Schema);
  psVar1 = (string *)local_1b8;
  std::__cxx11::string::~string(psVar1);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_70,0x7e,&local_80);
  local_1b8[8] = 0;
  local_1b8._0_8_ = &PTR__lazy_ostream_001f1370;
  local_1b8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88 = "";
  local_138.super_Schema = (Schema)0x1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_1b8,&local_90,0x7e,1,2,&caught,"caught",(allocator<char> *)&local_138,"true");
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b8,"mylong2",local_191);
  avro::LongSchema::LongSchema(&local_138);
  avro::RecordSchema::addField((string *)&record,(Schema *)local_1b8);
  avro::Schema::~Schema(&local_138.super_Schema);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"anotherint",(allocator<char> *)&local_138);
  avro::RecordSchema::addField((string *)&record,(Schema *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  avro::ValidSchema::setSchema((Schema *)this);
  avro::Schema::~Schema((Schema *)&fixed);
  avro::Schema::~Schema((Schema *)&nestedRecord);
  avro::Schema::~Schema((Schema *)&onion);
  avro::Schema::~Schema((Schema *)&myenum);
  std::__cxx11::string::~string((string *)&s);
  avro::Schema::~Schema((Schema *)&array);
  avro::Schema::~Schema((Schema *)&map);
  avro::Schema::~Schema(&intSchema.super_Schema);
  avro::Schema::~Schema((Schema *)&record);
  return;
}

Assistant:

void buildSchema()
    {
        RecordSchema record("RootRecord");

        record.addField("mylong", LongSchema());

        IntSchema intSchema;
        avro::MapSchema map = MapSchema(IntSchema());

        record.addField("mymap", map);

        ArraySchema array = ArraySchema(DoubleSchema());

        const std::string s("myarray");
        record.addField(s, array);

        EnumSchema myenum("ExampleEnum");
        myenum.addSymbol("zero");
        myenum.addSymbol("one");
        myenum.addSymbol("two");
        myenum.addSymbol("three");

        bool caught = false;
        try {
            myenum.addSymbol("three");
        }
        catch(Exception &e) {
            std::cout << "(intentional) exception: " << e.what() << '\n';
            caught = true;
        }
        BOOST_CHECK_EQUAL(caught, true);

        record.addField("myenum", myenum); 

        UnionSchema onion;
        onion.addType(NullSchema());
        onion.addType(map);
        onion.addType(FloatSchema());
       
        record.addField("myunion", onion); 

        RecordSchema nestedRecord("NestedRecord");
        nestedRecord.addField("floatInNested", FloatSchema());

        record.addField("nested", nestedRecord);

        record.addField("mybool", BoolSchema());
        FixedSchema fixed(16, "fixed16");
        record.addField("myfixed", fixed);

        caught = false;
        try {
            record.addField("mylong", LongSchema());
        }
        catch(Exception &e) {
            std::cout << "(intentional) exception: " << e.what() << '\n';
            caught = true;
        }
        BOOST_CHECK_EQUAL(caught, true);

        record.addField("mylong2", LongSchema());

        record.addField("anotherint", intSchema);

        schema_.setSchema(record);
    }